

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2vd_parser.c
# Opt level: O3

MPP_RET m2vd_parser_init(void *ctx,ParserCfg *parser_cfg)

{
  MPP_RET MVar1;
  undefined8 in_RAX;
  M2VDParserContext *ctx_00;
  void *pvVar2;
  undefined4 uVar3;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  ctx_00 = *ctx;
  if (((byte)m2vd_debug & 1) != 0) {
    uVar3 = 0;
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_I",0xf3,"m2vd_parser_init")
    ;
  }
  if (ctx_00 == (M2VDParserContext *)0x0) {
    ctx_00 = (M2VDParserContext *)mpp_osal_calloc("m2vd_parser_init",0x308);
    if (ctx_00 == (M2VDParserContext *)0x0) {
      pvVar2 = mpp_osal_calloc("m2vd_parser_init",0x308);
      _mpp_log_l(4,"m2vd_parser","malloc buffer error(%d), pointer:%p\n",(char *)0x0,0xf5,pvVar2);
      if (((byte)m2vd_debug & 2) == 0) {
        return MPP_ERR_MALLOC;
      }
      _mpp_log_l(2,"m2vd_parser","Assertion %s failed at %s:%d\n",(char *)0x0,"0","m2vd_parser_init"
                 ,CONCAT44(uVar3,0xf5));
      if ((mpp_debug._3_1_ & 0x10) == 0) {
        return MPP_ERR_MALLOC;
      }
      abort();
    }
    *(M2VDParserContext **)ctx = ctx_00;
  }
  MVar1 = m2vd_parser_init_ctx(ctx_00,parser_cfg);
  if (MVar1 < MPP_OK) {
    MVar1 = m2vd_parser_init_ctx(ctx_00,parser_cfg);
    if (((byte)m2vd_debug & 4) != 0) {
      _mpp_log_l(4,"m2vd_parser","func return error(L%d), ret:%d\n",(char *)0x0,0xf9,
                 (ulong)(uint)MVar1);
    }
  }
  else {
    MVar1 = MPP_OK;
    mpp_env_get_u32("m2vd_debug",&m2vd_debug,0);
    if (((byte)m2vd_debug & 1) != 0) {
      MVar1 = MPP_OK;
      _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_O",0xfd,
                 "m2vd_parser_init");
    }
  }
  return MVar1;
}

Assistant:

MPP_RET m2vd_parser_init(void *ctx, ParserCfg *parser_cfg)
{
    MPP_RET ret = MPP_OK;
    M2VDContext *c = (M2VDContext *)ctx;
    M2VDParserContext *p = (M2VDParserContext *)c->parse_ctx;
    m2vd_dbg_func("FUN_I");
    if (p == NULL) {
        M2VD_CHK_M(p = (M2VDParserContext*)mpp_calloc(M2VDParserContext, 1));
        c->parse_ctx = p;
    }

    M2VD_CHK_F(m2vd_parser_init_ctx(p, parser_cfg));

    mpp_env_get_u32("m2vd_debug", &m2vd_debug, 0);

    m2vd_dbg_func("FUN_O");
__FAILED:
    return ret;
}